

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_heat1D_adapt.c
# Opt level: O2

int f(sunrealtype t,N_Vector y,N_Vector ydot,void *user_data)

{
  double *pdVar1;
  double dVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  void *flagvalue;
  void *flagvalue_00;
  int iVar6;
  long lVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar16;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  
  lVar3 = *user_data;
  lVar4 = *(long *)((long)user_data + 8);
  dVar2 = *(double *)((long)user_data + 0x10);
  flagvalue = (void *)N_VGetArrayPointer();
  iVar5 = check_flag(flagvalue,"N_VGetArrayPointer",0);
  iVar6 = 1;
  if (iVar5 == 0) {
    flagvalue_00 = (void *)N_VGetArrayPointer(ydot);
    iVar5 = check_flag(flagvalue_00,"N_VGetArrayPointer",0);
    if (iVar5 == 0) {
      N_VConst(0,ydot);
      lVar7 = 1;
      while (lVar7 < lVar3 + -1) {
        dVar8 = *(double *)((long)flagvalue + lVar7 * 8) * dVar2;
        pdVar1 = (double *)(lVar4 + lVar7 * 8);
        dVar9 = *pdVar1;
        dVar11 = dVar9 - *(double *)(lVar4 + -8 + lVar7 * 8);
        dVar12 = pdVar1[1] - dVar9;
        dVar13 = *(double *)((long)flagvalue + lVar7 * 8 + -8) * dVar2;
        dVar16 = *(double *)((long)flagvalue + lVar7 * 8 + 8) * dVar2;
        auVar14._0_8_ = dVar13 + dVar13;
        auVar14._8_8_ = dVar16 + dVar16;
        auVar15._8_8_ = (dVar11 + dVar12) * dVar12;
        auVar15._0_8_ = (dVar11 + dVar12) * dVar11;
        auVar15 = divpd(auVar14,auVar15);
        dVar9 = exp((dVar9 + -0.25) * -200.0 * (dVar9 + -0.25));
        dVar13 = *(double *)(lVar4 + lVar7 * 8) + -0.7;
        dVar13 = exp(dVar13 * -400.0 * dVar13);
        dVar16 = *(double *)(lVar4 + lVar7 * 8) + -0.4;
        dVar16 = exp(dVar16 * -500.0 * dVar16);
        dVar10 = *(double *)(lVar4 + lVar7 * 8) + -0.55;
        dVar10 = exp(dVar10 * -600.0 * dVar10);
        *(double *)((long)flagvalue_00 + lVar7 * 8) =
             (dVar16 + ((dVar9 + dVar9 +
                        auVar15._8_8_ + (auVar15._0_8_ - (dVar8 + dVar8) / (dVar12 * dVar11))) -
                       dVar13)) - (dVar10 + dVar10);
        lVar7 = lVar7 + 1;
      }
      iVar6 = 0;
    }
  }
  return iVar6;
}

Assistant:

static int f(sunrealtype t, N_Vector y, N_Vector ydot, void* user_data)
{
  UserData udata = (UserData)user_data; /* access problem data */
  sunindextype N = udata->N;            /* set variable shortcuts */
  sunrealtype k  = udata->k;
  sunrealtype* x = udata->x;
  sunrealtype *Y = NULL, *Ydot = NULL;
  sunrealtype dxL, dxR;
  sunindextype i;

  /* access data arrays */
  Y = N_VGetArrayPointer(y);
  if (check_flag((void*)Y, "N_VGetArrayPointer", 0)) { return 1; }
  Ydot = N_VGetArrayPointer(ydot);
  if (check_flag((void*)Ydot, "N_VGetArrayPointer", 0)) { return 1; }

  /* Initialize ydot to zero - also handles boundary conditions */
  N_VConst(ZERO, ydot);

  /* iterate over domain interior, computing all equations */
  for (i = 1; i < N - 1; i++)
  { /* interior */
    dxL = x[i] - x[i - 1];
    dxR = x[i + 1] - x[i];
    Ydot[i] =
      Y[i - 1] * k * TWO / (dxL * (dxL + dxR)) - Y[i] * k * TWO / (dxL * dxR) +
      Y[i + 1] * k * TWO / (dxR * (dxL + dxR)) +
      TWO * exp(-TWOHUNDRED * (x[i] - PT25) * (x[i] - PT25)) /* source term */
      - exp(-FOURHUNDRED * (x[i] - PT7) * (x[i] - PT7)) +
      exp(-FIVEHUNDRED * (x[i] - PT4) * (x[i] - PT4)) -
      TWO * exp(-SIXHUNDRED * (x[i] - PT55) * (x[i] - PT55));
  }

  return 0; /* Return with success */
}